

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O1

EC_T_DWORD __thiscall
CEmNotification::emRasNotify(CEmNotification *this,EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  uint *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  CAtEmLogging *pCVar4;
  uint uVar5;
  EC_T_DWORD EVar6;
  char *pcVar7;
  uint uVar8;
  
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  if ((int)dwCode < 0x110001) {
    if (dwCode == 0x100001) {
      uVar5 = pParms->dwInBufSize;
      if (uVar5 < 8) {
        CAtEmLogging::LogError
                  (this->m_pcLogging,"RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
        EVar6 = 0x9811000b;
      }
      else {
        puVar1 = (uint *)pParms->pbyInBuf;
        uVar8 = *puVar1;
        pCVar4 = this->m_pcLogging;
        if (uVar8 == 0) {
          CAtEmLogging::LogMsg(pCVar4,"RAS Connection changed: Established!\n");
          this->m_bRasServerDisconnect = 0;
        }
        else {
          uVar2 = ecatGetText(uVar8);
          CAtEmLogging::LogMsg
                    (pCVar4,"RAS Connection changed: Cause: %s (0x%lx)\n",uVar2,(ulong)*puVar1);
          this->m_bRasServerDisconnect = 1;
        }
        EVar6 = 0x98110000;
      }
      if (7 < uVar5) {
        return 0;
      }
      return EVar6;
    }
    if (dwCode == 0x100002) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar4 = this->m_pcLogging;
      pcVar7 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n";
LAB_0014db5c:
      CAtEmLogging::LogError(pCVar4,pcVar7);
      return 0x9811000b;
    }
    if (dwCode == 0x100003) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar4 = this->m_pcLogging;
      pcVar7 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER";
      goto LAB_0014db5c;
    }
switchD_0014da03_default:
    pCVar4 = this->m_pcLogging;
    uVar2 = ecatGetNotifyText(dwCode);
    pcVar7 = "emRasNotify: name = %s code = 0x%x";
    uVar3 = (ulong)dwCode;
LAB_0014dbdd:
    CAtEmLogging::LogError(pCVar4,pcVar7,uVar2,uVar3);
  }
  else {
    switch(dwCode) {
    case 0x110001:
      if (0xf < pParms->dwInBufSize) {
        puVar1 = (uint *)pParms->pbyInBuf;
        CAtEmLogging::LogError(this->m_pcLogging,"Marshaling error! Cookie: 0x%lx",(ulong)*puVar1);
        pCVar4 = this->m_pcLogging;
        uVar5 = puVar1[3];
        uVar2 = ecatGetText(puVar1[1]);
        CAtEmLogging::LogError
                  (pCVar4,"Command: 0x%lx, Cause: %s (0x%lx)",(ulong)uVar5,uVar2,(ulong)puVar1[1]);
        CAtEmLogging::LogError(this->m_pcLogging,"Protocol Header: 0x%lx",(ulong)puVar1[2]);
        return 0;
      }
      CAtEmLogging::LogError
                (this->m_pcLogging,"Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
      return 0x9811000b;
    case 0x110002:
      pCVar4 = this->m_pcLogging;
      uVar2 = ecatGetText(*(uint *)pParms->pbyInBuf);
      uVar3 = (ulong)*(uint *)pParms->pbyInBuf;
      pcVar7 = "Acknowledge error! Error: %s (0x%lx)";
      goto LAB_0014dbdd;
    case 0x110003:
      uVar5 = *(uint *)pParms->pbyInBuf;
      uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar4 = this->m_pcLogging;
      uVar2 = ecatGetNotifyText(uVar8);
      pcVar7 = "Out of notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    case 0x110004:
      uVar5 = *(uint *)pParms->pbyInBuf;
      uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar4 = this->m_pcLogging;
      uVar2 = ecatGetNotifyText(uVar8);
      pcVar7 = "Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    case 0x110005:
      uVar5 = *(uint *)pParms->pbyInBuf;
      uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar4 = this->m_pcLogging;
      uVar2 = ecatGetNotifyText(uVar8);
      pcVar7 = "Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    default:
      goto switchD_0014da03_default;
    }
    CAtEmLogging::LogError(pCVar4,pcVar7,uVar2,(ulong)uVar8,(ulong)uVar5);
  }
  return 0;
}

Assistant:

EC_T_DWORD CEmNotification::emRasNotify(
    EC_T_DWORD          dwCode,     /**< [in]   Notification code identifier */
    EC_T_NOTIFYPARMS*   pParms      /**< [in]   Notification data portion */
                                       )
{
    EC_T_DWORD dwRetVal = EC_E_ERROR;

    if ((EC_NULL == pParms))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    switch (dwCode)
    {
    case ATEMRAS_NOTIFY_CONNECTION:         /* GENERIC RAS | 1 */
        {
            ATEMRAS_PT_CONNOTIFYDESC    pConNot = EC_NULL;
            if (sizeof(ATEMRAS_T_CONNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pConNot = (ATEMRAS_PT_CONNOTIFYDESC)pParms->pbyInBuf;

            if (pConNot->dwCause == EC_E_NOERROR)
            {
                LogMsg("RAS Connection changed: Established!\n");
                m_bRasServerDisconnect = EC_FALSE;
            }
            else
            {
                LogMsg("RAS Connection changed: Cause: %s (0x%lx)\n",
                    ((EMRAS_E_ERROR == (pConNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pConNot->dwCause):ecatGetText(pConNot->dwCause)), pConNot->dwCause);
                m_bRasServerDisconnect = EC_TRUE;
            }
        } break;
    case ATEMRAS_NOTIFY_REGISTER:           /* GENERIC RAS | 2 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_UNREGISTER:         /* GENERIC RAS | 3 */
        {
            /* ATEMRAS_PT_REGNOTIFYDESC pReg = EC_NULL; */

            if (sizeof(ATEMRAS_T_REGNOTIFYDESC) > pParms->dwInBufSize)
            {
                LogError("RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

/*
            pReg = (ATEMRAS_PT_REGNOTIFYDESC) pParms->pbyInBuf;
            LogMsg("Client un-registered from cookie 0x%lx Instance 0x%lx Id 0x%lx Result %s (0x%lx)",
                pReg->dwCookie, pReg->dwInstanceId, pReg->dwClientId,
                ((EMRAS_E_ERROR == (pReg->dwResult&EMRAS_E_ERROR))?ecatGetText(EC_LOWORD(pReg->dwResult)):ecatGetText(EC_LOWORD(pReg->dwResult))),
                pReg->dwResult);
*/
        } break;
    case ATEMRAS_NOTIFY_MARSHALERROR:       /* ERROR RAS | 1 */
        {
            ATEMRAS_PT_MARSHALERRORDESC     pMarshNot = EC_NULL;
            if (sizeof(ATEMRAS_T_MARSHALERRORDESC) > pParms->dwInBufSize)
            {
                LogError("Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
                dwRetVal = EC_E_INVALIDPARM;
                goto Exit;
            }

            pMarshNot = (ATEMRAS_PT_MARSHALERRORDESC)pParms->pbyInBuf;
            LogError("Marshaling error! Cookie: 0x%lx", pMarshNot->dwCookie);
            LogError("Command: 0x%lx, Cause: %s (0x%lx)",
                pMarshNot->dwCommandCode,
                ((EMRAS_E_ERROR == (pMarshNot->dwCause&EMRAS_E_ERROR))?ecatGetText(pMarshNot->dwCause):ecatGetText(pMarshNot->dwCause)),
                pMarshNot->dwCause);
            LogError("Protocol Header: 0x%lx", pMarshNot->dwLenStatCmd);
        } break;
    case ATEMRAS_NOTIFY_ACKERROR:           /* ERROR RAS | 2 */
        {
            LogError("Acknowledge error! Error: %s (0x%lx)", ecatGetText(EC_GETDWORD(pParms->pbyInBuf)), EC_GETDWORD(pParms->pbyInBuf));
        } break;
    case ATEMRAS_NOTIFY_NONOTIFYMEMORY:     /* ERROR RAS | 3 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_STDNOTIFYMEMORYSMALL:   /* ERROR RAS | 4 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    case ATEMRAS_NOTIFY_MBXNOTIFYMEMORYSMALL:   /* ERROR RAS | 5 */
        {
            ATEMRAS_T_NONOTIFYMEMORYDESC NoNotifyMemoryDesc;
            ATEMRAS_PT_NONOTIFYMEMORYDESC pNoNotifyMemoryDescSerialized = (ATEMRAS_PT_NONOTIFYMEMORYDESC)pParms->pbyInBuf;
            OsDbgAssert(pParms->dwInBufSize >= sizeof(ATEMRAS_T_NONOTIFYMEMORYDESC));
            NoNotifyMemoryDesc.dwCookie = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCookie);
            NoNotifyMemoryDesc.dwCode = EC_GET_FRM_DWORD(&pNoNotifyMemoryDescSerialized->dwCode);

            LogError("Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n",
                ecatGetNotifyText(NoNotifyMemoryDesc.dwCode), NoNotifyMemoryDesc.dwCode, NoNotifyMemoryDesc.dwCookie);
        } break;
    default:
        {
            LogError("emRasNotify: name = %s code = 0x%x", ecatGetNotifyText(dwCode), dwCode);
        } break;
    }

    dwRetVal = EC_E_NOERROR;
Exit:
    return dwRetVal;
}